

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::ShaderCompilerCase::ShaderCompilerCase
          (ShaderCompilerCase *this,Context *context,char *name,char *description,int caseID,
          bool avoidCache,bool addWhitespaceAndComments)

{
  int iVar1;
  deUint64 dVar2;
  deUint64 dVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,NODETYPE_PERFORMANCE,name,description)
  ;
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderCompilerMandelbrotCase_02156500;
  this->m_viewportWidth = 0;
  this->m_viewportHeight = 0;
  this->m_avoidCache = avoidCache;
  this->m_addWhitespaceAndComments = addWhitespaceAndComments;
  dVar2 = deGetTime();
  dVar3 = deGetMicroseconds();
  uVar7 = ~dVar2 + dVar2 * 0x200000;
  uVar7 = (uVar7 >> 0x18 ^ uVar7) * 0x109;
  uVar7 = (uVar7 >> 0xe ^ uVar7) * 0x15;
  uVar4 = dVar3 * 0x200000 + ~dVar3;
  uVar4 = (uVar4 >> 0x18 ^ uVar4) * 0x109;
  uVar4 = (uVar4 >> 0xe ^ uVar4) * 0x15;
  uVar6 = ((uint)caseID >> 0x10 ^ caseID ^ 0x3d) * 9;
  uVar6 = (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d;
  this->m_startHash =
       uVar6 >> 0xf ^ ((uint)(uVar7 >> 0x1c) ^ (uint)uVar7) * -0x7fffffff ^
       ((uint)(uVar4 >> 0x1c) ^ (uint)uVar4) * -0x7fffffff ^ uVar6;
  iVar1 = tcu::CommandLine::getTestIterationCount(context->m_testCtx->m_cmdLine);
  iVar5 = 0xf;
  if (0 < iVar1) {
    iVar5 = iVar1;
  }
  this->m_minimumMeasurementCount = iVar5;
  this->m_maximumMeasurementCount = iVar5 * 3;
  return;
}

Assistant:

ShaderCompilerCase::ShaderCompilerCase (Context& context, const char* name, const char* description, int caseID, bool avoidCache, bool addWhitespaceAndComments)
	: TestCase								(context, tcu::NODETYPE_PERFORMANCE, name, description)
	, m_viewportWidth						(0)
	, m_viewportHeight						(0)
	, m_avoidCache							(avoidCache)
	, m_addWhitespaceAndComments			(addWhitespaceAndComments)
	, m_startHash							((deUint32)(deUint64Hash(deGetTime()) ^ deUint64Hash(deGetMicroseconds()) ^ deInt32Hash(caseID)))
{
	int cmdLineIterCount = context.getTestContext().getCommandLine().getTestIterationCount();
	m_minimumMeasurementCount = cmdLineIterCount > 0 ? cmdLineIterCount : DEFAULT_MINIMUM_MEASUREMENT_COUNT;
	m_maximumMeasurementCount = m_minimumMeasurementCount*3;
}